

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.hpp
# Opt level: O0

uint32_t __thiscall
pstore::crc32<pstore::gsl::span<pstore::header::body_const,_1l>>
          (pstore *this,span<const_pstore::header::body,__1L> buf)

{
  const_reference pvVar1;
  long local_30;
  index_type size;
  pointer peStack_20;
  uint32_t crc;
  uint8_t *p;
  span<const_pstore::header::body,__1L> buf_local;
  
  buf_local.storage_.super_extent_type<_1L> = buf.storage_.super_extent_type<_1L>.size_;
  p = (uint8_t *)this;
  peStack_20 = gsl::span<const_pstore::header::body,_-1L>::data
                         ((span<const_pstore::header::body,__1L> *)&p);
  size._4_4_ = 0;
  local_30 = gsl::span<const_pstore::header::body,_-1L>::size_bytes
                       ((span<const_pstore::header::body,__1L> *)&p);
  while (local_30 != 0) {
    pvVar1 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)details::crc32_tab,
                        (ulong)((size._4_4_ ^ (peStack_20->signature1)._M_elems[0]) & 0xff));
    size._4_4_ = *pvVar1 ^ size._4_4_ >> 8;
    local_30 = local_30 + -1;
    peStack_20 = (pointer)((peStack_20->signature1)._M_elems + 1);
  }
  return size._4_4_ ^ 0xffffffff;
}

Assistant:

std::uint32_t crc32 (SpanType buf) noexcept {
        auto * p = reinterpret_cast<std::uint8_t const *> (buf.data ());
        auto crc = std::uint32_t{0};
        auto size = buf.size_bytes ();
        while (size--) {
            crc = details::crc32_tab[(crc ^ *p++) & 0xFF] ^ (crc >> 8);
        }
        return crc ^ ~0U;
    }